

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumofintegerfromfile.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  istream *piVar2;
  reference piVar3;
  ostream *this;
  int *n;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int local_268;
  int sum;
  undefined1 local_258 [8];
  vector<int,_std::allocator<int>_> nums;
  string line;
  istream local_220 [8];
  ifstream stream;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(local_220,"/home/arkezar/fib",8);
  std::__cxx11::string::string
            ((string *)
             &nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_258);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_220,
                        (string *)
                        &nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    local_268 = std::__cxx11::stoi((string *)
                                   &nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,(size_t *)0x0,10);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_258,&local_268);
  }
  __range1._4_4_ = 0;
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_258);
  n = (int *)std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_258);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &n);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    __range1._4_4_ = *piVar3 + __range1._4_4_;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,__range1._4_4_);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_258);
  std::__cxx11::string::~string
            ((string *)
             &nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
//    ifstream stream(argv[1]);
    ifstream stream("/home/arkezar/fib");
    string line;
    vector<int> nums;
    while (getline(stream, line)) {
        nums.push_back(stoi(line));
    }
    int sum = 0;
    for(const auto& n : nums)
        sum += n;
    cout << sum << endl;
    return 0;
}